

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O0

UInt32 * crnlib::Hc_GetMatchesSpec
                   (UInt32 lenLimit,UInt32 curMatch,UInt32 pos,Byte *cur,CLzRef *son,
                   UInt32 _cyclicBufferPos,UInt32 _cyclicBufferSize,UInt32 cutValue,
                   UInt32 *distances,UInt32 maxLen)

{
  uint uVar1;
  Byte *pBVar2;
  UInt32 UVar3;
  UInt32 *pUVar4;
  UInt32 local_54;
  uint local_44;
  UInt32 len;
  Byte *pb;
  UInt32 delta;
  UInt32 _cyclicBufferPos_local;
  CLzRef *son_local;
  Byte *cur_local;
  UInt32 local_18;
  UInt32 pos_local;
  UInt32 curMatch_local;
  UInt32 lenLimit_local;
  
  son[_cyclicBufferPos] = curMatch;
  local_18 = curMatch;
  do {
    do {
      uVar1 = pos - local_18;
      UVar3 = cutValue - 1;
      if ((cutValue == 0) || (_cyclicBufferSize <= uVar1)) {
        return distances;
      }
      pBVar2 = cur + -(ulong)uVar1;
      if (_cyclicBufferPos < uVar1) {
        local_54 = _cyclicBufferSize;
      }
      else {
        local_54 = 0;
      }
      local_18 = son[(_cyclicBufferPos - uVar1) + local_54];
      cutValue = UVar3;
    } while ((pBVar2[maxLen] != cur[maxLen]) || (*pBVar2 != *cur));
    local_44 = 0;
    do {
      local_44 = local_44 + 1;
      if (local_44 == lenLimit) break;
    } while (pBVar2[local_44] == cur[local_44]);
    if (maxLen < local_44) {
      pUVar4 = distances + 1;
      *distances = local_44;
      distances = distances + 2;
      *pUVar4 = uVar1 - 1;
      maxLen = local_44;
      if (local_44 == lenLimit) {
        return distances;
      }
    }
  } while( true );
}

Assistant:

static UInt32* Hc_GetMatchesSpec(UInt32 lenLimit, UInt32 curMatch, UInt32 pos, const Byte* cur, CLzRef* son,
                                 UInt32 _cyclicBufferPos, UInt32 _cyclicBufferSize, UInt32 cutValue,
                                 UInt32* distances, UInt32 maxLen) {
  son[_cyclicBufferPos] = curMatch;
  for (;;) {
    UInt32 delta = pos - curMatch;
    if (cutValue-- == 0 || delta >= _cyclicBufferSize)
      return distances;
    {
      const Byte* pb = cur - delta;
      curMatch = son[_cyclicBufferPos - delta + ((delta > _cyclicBufferPos) ? _cyclicBufferSize : 0)];
      if (pb[maxLen] == cur[maxLen] && *pb == *cur) {
        UInt32 len = 0;
        while (++len != lenLimit)
          if (pb[len] != cur[len])
            break;
        if (maxLen < len) {
          *distances++ = maxLen = len;
          *distances++ = delta - 1;
          if (len == lenLimit)
            return distances;
        }
      }
    }
  }
}